

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_error_code.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::signal_error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int ev)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  uVar1 = ev - 1;
  if (uVar1 < 0x1f) {
    pcVar3 = &DAT_003f0df0 + *(int *)(&DAT_003f0df0 + (ulong)uVar1 * 4);
    pcVar2 = &DAT_003f0e6c + *(int *)(&DAT_003f0e6c + (ulong)uVar1 * 4);
  }
  else {
    pcVar2 = "";
    pcVar3 = "unknown";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const noexcept override
		{
#define SIGNAL_CASE(x) case sig::errors::error_code_enum:: x: return #x;
			switch (ev)
			{
			SIGNAL_CASE(abort)
			SIGNAL_CASE(alarm)
			SIGNAL_CASE(arithmetic_exception)
			SIGNAL_CASE(hangup)
			SIGNAL_CASE(illegal)
			SIGNAL_CASE(interrupt)
			SIGNAL_CASE(kill)
			SIGNAL_CASE(pipe)
			SIGNAL_CASE(quit)
			case sig::errors::error_code_enum::segmentation: return "segmentation fault";
			SIGNAL_CASE(terminate)
			SIGNAL_CASE(user1)
			SIGNAL_CASE(user2)
			SIGNAL_CASE(child)
			SIGNAL_CASE(cont)
			SIGNAL_CASE(stop)
			SIGNAL_CASE(terminal_stop)
			SIGNAL_CASE(terminal_in)
			SIGNAL_CASE(terminal_out)
			SIGNAL_CASE(bus)
#ifdef SIGPOLL
			SIGNAL_CASE(poll)
#endif
			SIGNAL_CASE(profiler)
			SIGNAL_CASE(system_call)
			SIGNAL_CASE(trap)
			SIGNAL_CASE(urgent_data)
			SIGNAL_CASE(virtual_timer)
			SIGNAL_CASE(cpu_limit)
			SIGNAL_CASE(file_size_limit)
			default: return "unknown";
			}
#undef SIGNAL_CASE
		}